

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

Word * cppjieba::GetWordFromRunes(string *s,const_iterator left,const_iterator right)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  Word *in_RDI;
  uint32_t unicode_length;
  uint32_t len;
  uint32_t in_stack_ffffffffffffff8c;
  string *psVar1;
  Word *this;
  string local_48 [32];
  int local_28;
  int local_24;
  
  if (*(uint *)(in_RDX + 4) <= *(uint *)(in_RCX + 4)) {
    local_24 = (*(int *)(in_RCX + 4) - *(int *)(in_RDX + 4)) + *(int *)(in_RCX + 8);
    local_28 = (*(int *)(in_RCX + 0xc) - *(int *)(in_RDX + 0xc)) + *(int *)(in_RCX + 0x10);
    psVar1 = local_48;
    this = in_RDI;
    std::__cxx11::string::substr((ulong)psVar1,in_RSI);
    Word::Word(this,&in_RDI->word,(uint32_t)((ulong)psVar1 >> 0x20),(uint32_t)psVar1,
               in_stack_ffffffffffffff8c);
    std::__cxx11::string::~string(local_48);
    return this;
  }
  __assert_fail("right->offset >= left->offset",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/Unicode.hpp"
                ,0xc2,
                "Word cppjieba::GetWordFromRunes(const string &, RuneStrArray::const_iterator, RuneStrArray::const_iterator)"
               );
}

Assistant:

inline Word GetWordFromRunes(const string& s, RuneStrArray::const_iterator left, RuneStrArray::const_iterator right) {
  assert(right->offset >= left->offset);
  uint32_t len = right->offset - left->offset + right->len;
  uint32_t unicode_length = right->unicode_offset - left->unicode_offset + right->unicode_length;
  return Word(s.substr(left->offset, len), left->offset, left->unicode_offset, unicode_length);
}